

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.c
# Opt level: O0

Hash * compute_run_hash(Hash *__return_storage_ptr__,Hash *exe_hash,PerfProfInput *input,char **args
                       ,int32_t num_args)

{
  BYTE *data;
  size_t len;
  int local_9c;
  undefined1 local_98 [4];
  int32_t i;
  SHA256_CTX shactx;
  int32_t num_args_local;
  char **args_local;
  PerfProfInput *input_local;
  Hash *exe_hash_local;
  
  shactx.state[7] = num_args;
  if (input != (PerfProfInput *)0x0) {
    sha256_init((SHA256_CTX *)local_98);
    for (local_9c = 0; local_9c < (int)shactx.state[7]; local_9c = local_9c + 1) {
      data = (BYTE *)args[local_9c];
      len = strlen(args[local_9c]);
      sha256_update((SHA256_CTX *)local_98,data,len);
    }
    if (exe_hash != (Hash *)0x0) {
      sha256_update((SHA256_CTX *)local_98,(BYTE *)exe_hash,0x40);
    }
    sha256_update((SHA256_CTX *)local_98,&(input->uid).seedidx,1);
    sha256_update((SHA256_CTX *)local_98,(BYTE *)&(input->uid).hash,0x40);
    memset(__return_storage_ptr__,0,0x41);
    sha256_finalize_to_cstr((SHA256_CTX *)local_98,__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __assert_fail("input",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/hashing.c"
                ,0x5a,"Hash compute_run_hash(const Hash *, const PerfProfInput *, char **, int32_t)"
               );
}

Assistant:

Hash compute_run_hash(const Hash *exe_hash, const PerfProfInput *input,
                      char *args[PROC_MAX_ARGS], int32_t num_args) {
    assert(input);

    SHA256_CTX shactx;
    sha256_init(&shactx);

    for (int32_t i = 0; i < num_args; i++) {
        sha256_update(&shactx, (const BYTE *)(&args[i][0]), strlen(args[i]));
    }

    if (exe_hash) {
        sha256_update(&shactx, (const BYTE *)(&exe_hash->cstr[0]), 64);
    }

    sha256_update(&shactx, (const BYTE *)(&input->uid.seedidx),
                  sizeof(input->uid.seedidx));
    sha256_update(&shactx, (const BYTE *)(&input->uid.hash.cstr[0]), 64);

    Hash result = {0};
    sha256_finalize_to_cstr(&shactx, &result);
    return result;
}